

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpudpv6transmitter.cpp
# Opt level: O3

void __thiscall jrtplib::RTPUDPv6Transmitter::~RTPUDPv6Transmitter(RTPUDPv6Transmitter *this)

{
  _List_node_base *p_Var1;
  _List_node_base *p_Var2;
  
  (this->super_RTPTransmitter).super_RTPMemoryObject._vptr_RTPMemoryObject =
       (_func_int **)&PTR__RTPUDPv6Transmitter_0013c2c0;
  Destroy(this);
  RTPAbortDescriptors::~RTPAbortDescriptors(&this->m_abortDesc);
  RTPKeyHashTable<const_in6_addr,_jrtplib::RTPUDPv6Transmitter::PortInfo_*,_jrtplib::RTPUDPv6Trans_GetHashIndex_in6_addr,_8317>
  ::~RTPKeyHashTable(&this->acceptignoreinfo);
  p_Var2 = (this->rawpacketlist).
           super__List_base<jrtplib::RTPRawPacket_*,_std::allocator<jrtplib::RTPRawPacket_*>_>.
           _M_impl._M_node.super__List_node_base._M_next;
  while (p_Var2 != (_List_node_base *)&this->rawpacketlist) {
    p_Var1 = p_Var2->_M_next;
    operator_delete(p_Var2,0x18);
    p_Var2 = p_Var1;
  }
  RTPHashTable<const_in6_addr,_jrtplib::RTPUDPv6Trans_GetHashIndex_in6_addr,_8317>::~RTPHashTable
            (&this->multicastgroups);
  RTPHashTable<const_jrtplib::RTPIPv6Destination,_jrtplib::RTPUDPv6Trans_GetHashIndex_IPv6Dest,_8317>
  ::~RTPHashTable(&this->destinations);
  p_Var2 = (this->localIPs).super__List_base<in6_addr,_std::allocator<in6_addr>_>._M_impl._M_node.
           super__List_node_base._M_next;
  while (p_Var2 != (_List_node_base *)&this->localIPs) {
    p_Var1 = p_Var2->_M_next;
    operator_delete(p_Var2,0x20);
    p_Var2 = p_Var1;
  }
  return;
}

Assistant:

RTPUDPv6Transmitter::~RTPUDPv6Transmitter()
{
	Destroy();
}